

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O3

bool __thiscall
Omega_h::
CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse_impl(CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int *p_argc,char **argv,int i,bool should_print)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  int iVar3;
  long lVar4;
  
  __s = argv[i];
  pcVar2 = (char *)(this->value_)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->value_,0,pcVar2,(ulong)__s);
  iVar1 = *p_argc;
  iVar3 = iVar1 + -1;
  *p_argc = iVar3;
  if (i < iVar3) {
    lVar4 = (long)i + 1;
    do {
      argv[lVar4 + -1] = argv[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return true;
}

Assistant:

bool CmdLineArg<T>::parse_impl(
    int* p_argc, char** argv, int i, bool should_print) {
  if (!parse_arg(argv[i], &value_)) {
    if (should_print) {
      std::cout << "could not parse \"" << argv[i] << "\" as type "
                << ItemTraits<T>::name() << '\n';
    }
    return false;
  }
  shift(p_argc, argv, i);
  return true;
}